

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::enterFunction(Builder *this,Function *function)

{
  Id typeId;
  LinkageType linkType_00;
  Id IVar1;
  mapped_type_conflict *pmVar2;
  Instruction *pIVar3;
  char *name;
  Id funcId_1;
  LinkageType linkType;
  Instruction *local_28;
  Instruction *defInst;
  Id resultId;
  Id funcId;
  Function *function_local;
  Builder *this_local;
  
  this->restoreNonSemanticShaderDebugInfo = (bool)(this->emitNonSemanticShaderDebugInfo & 1);
  if ((this->sourceLang == SourceLanguageHLSL) && (function == this->entryPointFunction)) {
    this->emitNonSemanticShaderDebugInfo = false;
  }
  _resultId = function;
  function_local = (Function *)this;
  if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
    defInst._4_4_ = spv::Function::getFuncId(function);
    pmVar2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,(key_type_conflict *)((long)&defInst + 4));
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              (&this->currentDebugScopeId,pmVar2);
    defInst._0_4_ = getUniqueId(this);
    pIVar3 = (Instruction *)::operator_new(0x60);
    IVar1 = (Id)defInst;
    typeId = makeVoidType(this);
    spv::Instruction::Instruction(pIVar3,IVar1,typeId,OpExtInst);
    local_28 = pIVar3;
    spv::Instruction::reserveOperands(pIVar3,4);
    spv::Instruction::addIdOperand(local_28,this->nonSemanticShaderDebugInfo);
    spv::Instruction::addImmediateOperand(local_28,0x65);
    pIVar3 = local_28;
    pmVar2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,(key_type_conflict *)((long)&defInst + 4));
    spv::Instruction::addIdOperand(pIVar3,*pmVar2);
    spv::Instruction::addIdOperand(local_28,defInst._4_4_);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&funcId_1,
               local_28);
    addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &funcId_1);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&funcId_1);
  }
  linkType_00 = spv::Function::getLinkType(_resultId);
  if (linkType_00 != LinkageTypeMax) {
    IVar1 = spv::Function::getFuncId(_resultId);
    addCapability(this,CapabilityLinkage);
    name = spv::Function::getExportName(_resultId);
    addLinkageDecoration(this,IVar1,name,linkType_00);
  }
  return;
}

Assistant:

void Builder::enterFunction(Function const* function)
{
    // Save and disable debugInfo for HLSL entry point function. It is a wrapper
    // function with no user code in it.
    restoreNonSemanticShaderDebugInfo = emitNonSemanticShaderDebugInfo;
    if (sourceLang == spv::SourceLanguageHLSL && function == entryPointFunction) {
        emitNonSemanticShaderDebugInfo = false;
    }

    if (emitNonSemanticShaderDebugInfo) {
        // Initialize scope state
        Id funcId = function->getFuncId();
        currentDebugScopeId.push(debugId[funcId]);
        // Create DebugFunctionDefinition
        spv::Id resultId = getUniqueId();
        Instruction* defInst = new Instruction(resultId, makeVoidType(), OpExtInst);
        defInst->reserveOperands(4);
        defInst->addIdOperand(nonSemanticShaderDebugInfo);
        defInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugFunctionDefinition);
        defInst->addIdOperand(debugId[funcId]);
        defInst->addIdOperand(funcId);
        addInstruction(std::unique_ptr<Instruction>(defInst));
    }

    if (auto linkType = function->getLinkType(); linkType != LinkageTypeMax) {
        Id funcId = function->getFuncId();
        addCapability(CapabilityLinkage);
        addLinkageDecoration(funcId, function->getExportName(), linkType);
    }
}